

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

void __thiscall
mp::NLFeeder_Easy::FeedColNames<mp::StringFileWriter>(NLFeeder_Easy *this,StringFileWriter *wrt)

{
  bool bVar1;
  int i;
  long lVar2;
  
  if (((this->nlme_).var_names_ != (char **)0x0) &&
     (bVar1 = StringFileWriter::operator_cast_to_bool(wrt), bVar1)) {
    for (lVar2 = 0; lVar2 < (this->nlme_).vars_.num_col_; lVar2 = lVar2 + 1) {
      StringFileWriter::Write<char_const*>
                (wrt,(this->nlme_).var_names_
                     [(this->var_perm_).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar2].second]);
    }
  }
  return;
}

Assistant:

void FeedColNames(ColNameWriter& wrt) {
    if (NLME().ColNames() && wrt) {
      for (int i=0; i<NLME().NumCols(); ++i)
        wrt << NLME().ColNames()[VPermInv(i)];
    }
  }